

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O1

int mfflush(mFILE *mf)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  size_t bytes;
  ulong uVar5;
  
  if ((FILE *)mf->fp != (FILE *)0x0) {
    if ((m_channel_1 == mf) || (m_channel_2 == mf)) {
      uVar1 = mf->flush_pos;
      uVar5 = mf->size - uVar1;
      if (uVar1 <= mf->size && uVar5 != 0) {
        sVar3 = fwrite(mf->data + uVar1,1,uVar5,(FILE *)mf->fp);
        if (sVar3 < uVar5) {
          return -1;
        }
        iVar2 = fflush((FILE *)mf->fp);
        if (iVar2 != 0) {
          return -1;
        }
      }
      mf->size = 0;
      mf->offset = 0;
      mf->flush_pos = 0;
    }
    if ((mf->mode & 2U) != 0) {
      uVar1 = mf->flush_pos;
      uVar5 = mf->size - uVar1;
      if (uVar1 <= mf->size && uVar5 != 0) {
        if ((mf->mode & 0x20U) == 0) {
          fseek((FILE *)mf->fp,uVar1,0);
        }
        sVar3 = fwrite(mf->data + mf->flush_pos,1,uVar5,(FILE *)mf->fp);
        if (sVar3 < uVar5) {
          return -1;
        }
        iVar2 = fflush((FILE *)mf->fp);
        if (iVar2 != 0) {
          return -1;
        }
      }
      lVar4 = ftell((FILE *)mf->fp);
      if (lVar4 != -1) {
        iVar2 = fileno((FILE *)mf->fp);
        lVar4 = ftell((FILE *)mf->fp);
        iVar2 = ftruncate(iVar2,lVar4);
        if (iVar2 == -1) {
          return -1;
        }
      }
      mf->flush_pos = mf->size;
    }
  }
  return 0;
}

Assistant:

int mfflush(mFILE *mf) {
    if (!mf->fp)
	return 0;

    /* FIXME: only do this when opened in write mode */
    if (mf == m_channel[1] || mf == m_channel[2]) {
	if (mf->flush_pos < mf->size) {
	    size_t bytes = mf->size - mf->flush_pos;
	    if (fwrite(mf->data + mf->flush_pos, 1, bytes, mf->fp) < bytes)
		return -1;
	    if (0 != fflush(mf->fp))
		return -1;
	}

	/* Stdout & stderr are non-seekable streams so throw away the data */
	mf->offset = mf->size = mf->flush_pos = 0;
    }

    /* only flush when opened in write mode */
    if (mf->mode & MF_WRITE) {
	if (mf->flush_pos < mf->size) {
	    size_t bytes = mf->size - mf->flush_pos;
	    if (!(mf->mode & MF_MODEX)) {
		fseek(mf->fp, mf->flush_pos, SEEK_SET);
	    }
	    if (fwrite(mf->data + mf->flush_pos, 1, bytes, mf->fp) < bytes)
		return -1;
	    if (0 != fflush(mf->fp))
		return -1;
	}
	if (ftell(mf->fp) != -1 &&
	    ftruncate(fileno(mf->fp), ftell(mf->fp)) == -1)
		return -1;
	mf->flush_pos = mf->size;
    }

    return 0;
}